

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ModelPtr __thiscall libcellml::Parser::ParserImpl::parseModel(ParserImpl *this,string *input)

{
  IssueImpl *this_00;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ModelPtr MVar2;
  allocator<char> local_51;
  IssuePtr issue;
  string local_40;
  
  Logger::LoggerImpl::removeAllIssues((LoggerImpl *)input);
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (in_RDX->_M_string_length == 0) {
    Issue::IssueImpl::create();
    this_00 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              mPimpl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Model string is empty.",&local_51);
    Issue::IssueImpl::setDescription(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,XML);
    Logger::LoggerImpl::addIssue((LoggerImpl *)input,&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    Model::create();
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
    loadModel((ParserImpl *)input,(ModelPtr *)this,in_RDX);
    _Var1._M_pi = extraout_RDX;
  }
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Parser::ParserImpl::parseModel(const std::string &input)
{
    removeAllIssues();
    ModelPtr model = nullptr;
    if (input.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Model string is empty.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
        addIssue(issue);
    } else {
        model = Model::create();
        loadModel(model, input);
    }
    return model;
}